

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

void __thiscall cmDependsFortran::cmDependsFortran(cmDependsFortran *this)

{
  _Rb_tree_header *p_Var1;
  
  cmDepends::cmDepends(&this->super_cmDepends,(cmLocalGenerator *)0x0,"");
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsFortran_006dd598;
  (this->SourceFile)._M_dataplus._M_p = (pointer)&(this->SourceFile).field_2;
  (this->SourceFile)._M_string_length = 0;
  (this->SourceFile).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Internal = (cmDependsFortranInternals *)0x0;
  return;
}

Assistant:

cmDependsFortran::cmDependsFortran():
  Internal(0)
{
}